

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Expected<llvm::DWARFDebugRnglistTable> *
parseRngListTableHeader
          (Expected<llvm::DWARFDebugRnglistTable> *__return_storage_ptr__,DWARFDataExtractor *DA,
          uint64_t Offset,DwarfFormat Format)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  char *Fmt;
  size_t *psVar3;
  ulong uVar4;
  error_code EC;
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  local_e8;
  undefined8 uStack_e0;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  char *local_b0;
  undefined8 uStack_a8;
  char *local_a0;
  undefined8 uStack_98;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  local_90;
  char *local_60;
  undefined8 uStack_58;
  Error local_50;
  Error local_48;
  uint64_t local_40;
  uint64_t Offset_local;
  Error E;
  
  local_40 = Offset;
  if (Offset != 0) {
    uVar4 = 0xc;
    if (Format != DWARF32) {
      if (Format != DWARF64) {
        llvm::llvm_unreachable_internal
                  ("Invalid DWARF format (expected DWARF32 or DWARF64",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                   ,0x73);
      }
      uVar4 = 0x14;
    }
    local_40 = Offset - uVar4;
    if (Offset < uVar4) {
      local_40 = Offset;
      Fmt = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = &local_50;
      llvm::createStringError<unsigned_long>
                (EC,Fmt,(unsigned_long *)
                        "Did not detect a valid range list table with base = 0x%lx\n");
      llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_50);
      if ((long *)((ulong)local_50.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_50.Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    if (Offset < uVar4) {
      return __return_storage_ptr__;
    }
  }
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  local_e8.buffer[0] = '\0';
  local_e8.buffer[1] = '\0';
  local_e8.buffer[2] = '\0';
  local_e8.buffer[3] = '\0';
  local_e8.buffer[4] = '\0';
  local_e8.buffer[5] = '\0';
  local_e8.buffer[6] = '\0';
  local_e8.buffer[7] = '\0';
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_b0 = ".debug_rnglists";
  uStack_a8 = 0xf;
  local_a0 = "range";
  uStack_98 = 5;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = "ranges:";
  uStack_58 = 7;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  llvm::DWARFListTableHeader::extract
            ((DWARFListTableHeader *)&Offset_local,*DA,(uint64_t *)&local_e8);
  uVar4 = Offset_local & 0xfffffffffffffffe;
  if (uVar4 == 0) {
    __return_storage_ptr__->field_0x98 = __return_storage_ptr__->field_0x98 & 0xfe;
    *&(__return_storage_ptr__->field_0).ErrorStorage.buffer = local_e8.buffer;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uStack_e0;
    *(void **)((long)&__return_storage_ptr__->field_0 + 0x10) = local_d8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = uStack_d0;
    *(long *)((long)&__return_storage_ptr__->field_0 + 0x20) = local_c8;
    local_d8 = (void *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x48) = local_a0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x50) = uStack_98;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x38) = local_b0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x40) = uStack_a8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x28) = local_c0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x30) = uStack_b8;
    p_Var2 = (_Base_ptr)((long)&__return_storage_ptr__->field_0 + 0x60);
    if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      *(undefined4 *)((long)&__return_storage_ptr__->field_0 + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x68) = 0;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x70) = p_Var2;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x78) = p_Var2;
      psVar3 = (size_t *)((long)&__return_storage_ptr__->field_0 + 0x80);
    }
    else {
      psVar3 = &local_90._M_impl.super__Rb_tree_header._M_node_count;
      *(_Rb_tree_color *)((long)&__return_storage_ptr__->field_0 + 0x60) =
           local_90._M_impl.super__Rb_tree_header._M_header._M_color;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x68) =
           local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x70) =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x78) =
           local_90._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var2;
      *(size_t *)((long)&__return_storage_ptr__->field_0 + 0x80) =
           local_90._M_impl.super__Rb_tree_header._M_node_count;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    Offset_local = uVar4 != 0 | uVar4;
    *psVar3 = 0;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x88) = local_60;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x90) = uStack_58;
  }
  else {
    local_48.Payload = (ErrorInfoBase *)(Offset_local | 1);
    Offset_local = 0;
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_48);
    if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)(Offset_local & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(Offset_local & 0xfffffffffffffffe) + 8))();
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  ::~_Rb_tree(&local_90);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

static Expected<DWARFDebugRnglistTable>
parseRngListTableHeader(DWARFDataExtractor &DA, uint64_t Offset,
                        DwarfFormat Format) {
  // We are expected to be called with Offset 0 or pointing just past the table
  // header. Correct Offset in the latter case so that it points to the start
  // of the header.
  if (Offset > 0) {
    uint64_t HeaderSize = DWARFListTableHeader::getHeaderSize(Format);
    if (Offset < HeaderSize)
      return createStringError(errc::invalid_argument, "Did not detect a valid"
                               " range list table with base = 0x%" PRIx64 "\n",
                               Offset);
    Offset -= HeaderSize;
  }
  llvm::DWARFDebugRnglistTable Table;
  if (Error E = Table.extractHeaderAndOffsets(DA, &Offset))
    return std::move(E);
  return Table;
}